

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::printShortStatistics(SoPlexBase<double> *this,ostream *os)

{
  ostream *poVar1;
  ostream *poVar2;
  SoPlexBase<double> *this_00;
  SoPlexBase<double> *in_RSI;
  ostream *in_RDI;
  double dVar3;
  undefined8 in_stack_ffffffffffffffd8;
  ostream *in_stack_ffffffffffffffe8;
  
  printStatus(in_RSI,in_stack_ffffffffffffffe8,(Status)((ulong)in_RDI >> 0x20));
  SPxOut::setFixed(in_RDI,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  poVar1 = std::operator<<((ostream *)in_RSI,"Solving time (sec)  : ");
  dVar3 = (double)(**(code **)(**(long **)(*(long *)(in_RDI + 0x20) + 8) + 0x30))();
  poVar2 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Iterations          : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(*(long *)(in_RDI + 0x20) + 0xb8));
  std::operator<<(poVar2,"\n");
  SPxOut::setScientific(in_RDI,(int)((ulong)poVar1 >> 0x20));
  this_00 = (SoPlexBase<double> *)std::operator<<((ostream *)in_RSI,"Objective value     : ");
  dVar3 = objValueReal(this_00);
  poVar1 = (ostream *)std::ostream::operator<<(this_00,dVar3);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void SoPlexBase<R>::printShortStatistics(std::ostream& os)
{
   printStatus(os, _status);
   SPxOut::setFixed(os, 2);
   os << "Solving time (sec)  : " << this->_statistics->solvingTime->time() << "\n"
      << "Iterations          : " << this->_statistics->iterations << "\n";
   SPxOut::setScientific(os);
   os << "Objective value     : " << objValueReal() << "\n";
}